

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall cmFindCommon::SetMakefile(cmFindCommon *this,cmMakefile *makefile)

{
  bool bVar1;
  allocator local_41;
  string local_40;
  
  (this->super_cmCommand).Makefile = makefile;
  std::__cxx11::string::string((string *)&local_40,"APPLE",&local_41);
  bVar1 = cmMakefile::IsOn(makefile,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    this->SearchFrameworkFirst = true;
    this->SearchAppBundleFirst = true;
  }
  return;
}

Assistant:

void cmFindCommon::SetMakefile(cmMakefile* makefile)
{
  cmCommand::SetMakefile(makefile);

  // If we are building for Apple (OSX or also iphone), make sure
  // that frameworks and bundles are searched first.
  if(this->Makefile->IsOn("APPLE"))
    {
    this->SearchFrameworkFirst = true;
    this->SearchAppBundleFirst = true;
    }
}